

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_compilation.cpp
# Opt level: O0

void __thiscall
pstore::exchange::import_ns::compilation::compilation
          (compilation *this,not_null<context_*> ctxt,not_null<transaction_base_*> transaction,
          not_null<const_string_mapping_*> names,fragment_index_pointer *fragments,digest *digest)

{
  digest *digest_local;
  fragment_index_pointer *fragments_local;
  compilation *this_local;
  not_null<const_string_mapping_*> names_local;
  not_null<transaction_base_*> transaction_local;
  not_null<context_*> ctxt_local;
  
  rule::rule(&this->super_rule,ctxt);
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__compilation_002389e8;
  (this->transaction_).ptr_ = transaction.ptr_;
  (this->names_).ptr_ = names.ptr_;
  std::
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::shared_ptr(&this->fragments_,fragments);
  *(long *)&(this->digest_).v_ = (long)digest->v_;
  *(undefined8 *)((long)&(this->digest_).v_ + 8) = *(undefined8 *)((long)&digest->v_ + 8);
  std::bitset<2UL>::bitset(&this->seen_);
  this->triple_ = 0;
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::vector
            (&this->definitions_);
  return;
}

Assistant:

compilation::compilation (not_null<context *> const ctxt,
                                      not_null<transaction_base *> const transaction,
                                      not_null<string_mapping const *> const names,
                                      fragment_index_pointer const & fragments,
                                      index::digest const & digest)
                    : rule (ctxt)
                    , transaction_{transaction}
                    , names_{names}
                    , fragments_{fragments}
                    , digest_{digest} {}